

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

Token * __thiscall TokenStream::lookahead(Token *__return_storage_ptr__,TokenStream *this)

{
  char cVar1;
  undefined3 uVar2;
  bool bVar3;
  Token *pTVar4;
  TokenStream *this_local;
  
  bVar3 = std::optional::operator_cast_to_bool((optional *)&this->stash);
  if (bVar3) {
    pTVar4 = std::optional<Token>::value(&this->stash);
    (__return_storage_ptr__->span).begin = (pTVar4->span).begin;
    (__return_storage_ptr__->span).end = (pTVar4->span).end;
    cVar1 = pTVar4->value;
    uVar2 = *(undefined3 *)&pTVar4->field_0x15;
    __return_storage_ptr__->type = pTVar4->type;
    __return_storage_ptr__->value = cVar1;
    *(undefined3 *)&__return_storage_ptr__->field_0x15 = uVar2;
  }
  else {
    std::function<Token_()>::operator()(__return_storage_ptr__,&this->supplier);
    std::optional<Token>::emplace<Token&>(&this->stash,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

auto TokenStream::lookahead() -> Token {
    if (stash)
        return stash.value();

    auto token = supplier();
    stash.emplace(token);
    return token;
}